

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveRowsFromBranchToRoot(tst_GenericModel *this)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QArrayDataPointer<char16_t> local_9c0;
  QString local_9a8;
  QModelIndex local_990;
  QVariant local_978;
  QString local_958;
  QArrayDataPointer<char16_t> local_940;
  QString local_928;
  QModelIndex local_910;
  QVariant local_8f8;
  QString local_8d8;
  QArrayDataPointer<char16_t> local_8c0;
  QString local_8a8;
  QModelIndex local_890;
  QVariant local_878;
  QString local_858;
  QVariant local_840;
  int local_81c;
  undefined1 local_818 [4];
  int i;
  QString local_800;
  QModelIndex local_7e8;
  QModelIndex local_7d0;
  QVariant local_7b8;
  QString local_798;
  QArrayDataPointer<char16_t> local_780;
  QString local_768;
  QModelIndex local_750;
  QModelIndex local_738;
  QVariant local_720;
  QString local_700;
  QArrayDataPointer<char16_t> local_6e8;
  QString local_6d0;
  QModelIndex local_6b8;
  QModelIndex local_6a0;
  QVariant local_688;
  QString local_668;
  QArrayDataPointer<char16_t> local_650;
  QString local_638;
  QModelIndex local_620;
  QModelIndex local_608;
  QVariant local_5f0;
  QString local_5d0;
  QArrayDataPointer<char16_t> local_5b8;
  QString local_5a0;
  QModelIndex local_588;
  QModelIndex local_570;
  QVariant local_558;
  QString local_538;
  QArrayDataPointer<char16_t> local_520;
  QString local_508;
  QModelIndex local_4f0;
  QModelIndex local_4d8;
  QVariant local_4c0;
  QString local_4a0;
  QArrayDataPointer<char16_t> local_488;
  QString local_470;
  QModelIndex local_458;
  QModelIndex local_440;
  QVariant local_428;
  QString local_408;
  QArrayDataPointer<char16_t> local_3f0;
  QString local_3d8;
  QModelIndex local_3c0;
  QModelIndex local_3a8;
  QVariant local_390;
  QString local_370;
  QArrayDataPointer<char16_t> local_358;
  QString local_340;
  QModelIndex local_328;
  QModelIndex local_310;
  QVariant local_2f8;
  QString local_2d8;
  QModelIndex local_2c0;
  QModelIndex local_2a8;
  undefined4 local_28c;
  QModelIndex local_288;
  QLatin1Char local_26f;
  QChar local_26e;
  QLatin1Char local_26b;
  QChar local_26a;
  QArrayDataPointer<char16_t> local_268;
  QString local_250;
  QString local_238;
  QString local_220;
  QVariant local_208;
  undefined1 local_1e8 [24];
  int local_1d0;
  uint local_1cc;
  int c;
  int r;
  undefined1 local_1b0 [8];
  QModelIndex parIndex;
  undefined1 local_170 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  char16_t *str_12;
  char16_t *str_11;
  char16_t *str_10;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_9;
  char16_t *str_8;
  char16_t *str_7;
  char16_t *str_6;
  char16_t *str_5;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_170,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0)
  ;
  QModelIndex::QModelIndex((QModelIndex *)&parIndex.m);
  fillTable(this,(QAbstractItemModel *)&probe.field_0x8,5,3,(QModelIndex *)&parIndex.m,0);
  QModelIndex::QModelIndex((QModelIndex *)&c);
  GenericModel::index((int)local_1b0,(int)&probe + 8,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x4);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x5);
  local_1cc = 0;
  while( true ) {
    uVar1 = local_1cc;
    iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
    if (iVar4 <= (int)uVar1) break;
    local_1d0 = 0;
    while( true ) {
      iVar4 = local_1d0;
      iVar5 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
      if (iVar5 <= iVar4) break;
      GenericModel::index((int)local_1e8,(int)&probe + 8,(QModelIndex *)(ulong)local_1cc);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_268,(Data *)0x0,L"r%1,c%2",7);
      QString::QString(&local_250,&local_268);
      uVar1 = local_1cc;
      QLatin1Char::QLatin1Char(&local_26b,' ');
      QChar::QChar(&local_26a,local_26b);
      QString::arg(&local_238,&local_250,uVar1,0,10,local_26a);
      iVar4 = local_1d0;
      QLatin1Char::QLatin1Char(&local_26f,' ');
      QChar::QChar(&local_26e,local_26f);
      QString::arg(&local_220,&local_238,iVar4,0,10,local_26e);
      QVariant::QVariant(&local_208,&local_220);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_1e8,(int)&local_208);
      QVariant::~QVariant(&local_208);
      QString::~QString(&local_220);
      QString::~QString(&local_238);
      QString::~QString(&local_250);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
      local_1d0 = local_1d0 + 1;
    }
    local_1cc = local_1cc + 1;
  }
  QModelIndex::QModelIndex(&local_288);
  bVar2 = GenericModel::moveRows
                    ((QModelIndex *)&probe.field_0x8,(int)local_1b0,1,(QModelIndex *)0x2,
                     (int)&local_288);
  bVar2 = QTest::qVerify((bool)(bVar2 & 1),"testModel.moveRows(parIndex, 1, 2, QModelIndex(), 0)",""
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7c3);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
    bVar2 = QTest::qCompare(iVar4,3,"testModel.rowCount(parIndex)","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7c4);
    if ((bVar2 & 1) == 0) {
      local_28c = 1;
    }
    else {
      iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
      bVar2 = QTest::qCompare(iVar4,4,"testModel.columnCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7c5);
      if ((bVar2 & 1) == 0) {
        local_28c = 1;
      }
      else {
        QModelIndex::QModelIndex(&local_2a8);
        iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
        bVar2 = QTest::qCompare(iVar4,7,"testModel.rowCount()","7",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7c6);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_2c0);
          iVar4 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
          bVar2 = QTest::qCompare(iVar4,4,"testModel.columnCount()","4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x7c7);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_328);
            GenericModel::index((int)&local_310,(int)&probe + 8,(QModelIndex *)0x0);
            QModelIndex::data(&local_2f8,&local_310,0);
            QVariant::toString();
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_358,(Data *)0x0,L"r1,c0",5);
            QString::QString(&local_340,&local_358);
            bVar3 = QTest::qCompare(&local_2d8,&local_340,"testModel.index(0, 0).data().toString()",
                                    "QStringLiteral(\"r1,c0\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x7c8);
            QString::~QString(&local_340);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
            QString::~QString(&local_2d8);
            QVariant::~QVariant(&local_2f8);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              QModelIndex::QModelIndex(&local_3c0);
              GenericModel::index((int)&local_3a8,(int)&probe + 8,(QModelIndex *)0x1);
              QModelIndex::data(&local_390,&local_3a8,0);
              QVariant::toString();
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3f0,(Data *)0x0,L"r2,c0",5);
              QString::QString(&local_3d8,&local_3f0);
              bVar3 = QTest::qCompare(&local_370,&local_3d8,
                                      "testModel.index(1, 0).data().toString()",
                                      "QStringLiteral(\"r2,c0\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x7c9);
              QString::~QString(&local_3d8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3f0);
              QString::~QString(&local_370);
              QVariant::~QVariant(&local_390);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                QModelIndex::QModelIndex(&local_458);
                GenericModel::index((int)&local_440,(int)&probe + 8,(QModelIndex *)0x0);
                QModelIndex::data(&local_428,&local_440,0);
                QVariant::toString();
                QArrayDataPointer<char16_t>::QArrayDataPointer(&local_488,(Data *)0x0,L"r1,c3",5);
                QString::QString(&local_470,&local_488);
                bVar3 = QTest::qCompare(&local_408,&local_470,
                                        "testModel.index(0, 3).data().toString()",
                                        "QStringLiteral(\"r1,c3\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x7ca);
                QString::~QString(&local_470);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_488);
                QString::~QString(&local_408);
                QVariant::~QVariant(&local_428);
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  QModelIndex::QModelIndex(&local_4f0);
                  GenericModel::index((int)&local_4d8,(int)&probe + 8,(QModelIndex *)0x1);
                  QModelIndex::data(&local_4c0,&local_4d8,0);
                  QVariant::toString();
                  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_520,(Data *)0x0,L"r2,c3",5);
                  QString::QString(&local_508,&local_520);
                  bVar3 = QTest::qCompare(&local_4a0,&local_508,
                                          "testModel.index(1, 3).data().toString()",
                                          "QStringLiteral(\"r2,c3\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x7cb);
                  QString::~QString(&local_508);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_520);
                  QString::~QString(&local_4a0);
                  QVariant::~QVariant(&local_4c0);
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_588);
                    GenericModel::index((int)&local_570,(int)&probe + 8,(QModelIndex *)0x2);
                    QModelIndex::data(&local_558,&local_570,0);
                    QVariant::toString();
                    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_5b8,(Data *)0x0,L"0,0",3);
                    QString::QString(&local_5a0,&local_5b8);
                    bVar3 = QTest::qCompare(&local_538,&local_5a0,
                                            "testModel.index(2, 0).data().toString()",
                                            "QStringLiteral(\"0,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x7cc);
                    QString::~QString(&local_5a0);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_5b8);
                    QString::~QString(&local_538);
                    QVariant::~QVariant(&local_558);
                    if (((bVar3 ^ 0xffU) & 1) == 0) {
                      QModelIndex::QModelIndex(&local_620);
                      GenericModel::index((int)&local_608,(int)&probe + 8,(QModelIndex *)0x3);
                      QModelIndex::data(&local_5f0,&local_608,0);
                      QVariant::toString();
                      QArrayDataPointer<char16_t>::QArrayDataPointer
                                (&local_650,(Data *)0x0,L"1,0",3);
                      QString::QString(&local_638,&local_650);
                      bVar3 = QTest::qCompare(&local_5d0,&local_638,
                                              "testModel.index(3, 0).data().toString()",
                                              "QStringLiteral(\"1,0\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x7cd);
                      QString::~QString(&local_638);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_650);
                      QString::~QString(&local_5d0);
                      QVariant::~QVariant(&local_5f0);
                      if (((bVar3 ^ 0xffU) & 1) == 0) {
                        QModelIndex::QModelIndex(&local_6b8);
                        GenericModel::index((int)&local_6a0,(int)&probe + 8,(QModelIndex *)0x4);
                        QModelIndex::data(&local_688,&local_6a0,0);
                        QVariant::toString();
                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                  (&local_6e8,(Data *)0x0,L"2,0",3);
                        QString::QString(&local_6d0,&local_6e8);
                        bVar3 = QTest::qCompare(&local_668,&local_6d0,
                                                "testModel.index(4, 0).data().toString()",
                                                "QStringLiteral(\"2,0\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x7ce);
                        QString::~QString(&local_6d0);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6e8);
                        QString::~QString(&local_668);
                        QVariant::~QVariant(&local_688);
                        if (((bVar3 ^ 0xffU) & 1) == 0) {
                          QModelIndex::QModelIndex(&local_750);
                          GenericModel::index((int)&local_738,(int)&probe + 8,(QModelIndex *)0x5);
                          QModelIndex::data(&local_720,&local_738,0);
                          QVariant::toString();
                          QArrayDataPointer<char16_t>::QArrayDataPointer
                                    (&local_780,(Data *)0x0,L"3,0",3);
                          QString::QString(&local_768,&local_780);
                          bVar3 = QTest::qCompare(&local_700,&local_768,
                                                  "testModel.index(5, 0).data().toString()",
                                                  "QStringLiteral(\"3,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,1999);
                          QString::~QString(&local_768);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_780);
                          QString::~QString(&local_700);
                          QVariant::~QVariant(&local_720);
                          if (((bVar3 ^ 0xffU) & 1) == 0) {
                            QModelIndex::QModelIndex(&local_7e8);
                            GenericModel::index((int)&local_7d0,(int)&probe + 8,(QModelIndex *)0x6);
                            QModelIndex::data(&local_7b8,&local_7d0,0);
                            QVariant::toString();
                            QArrayDataPointer<char16_t>::QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)local_818,(Data *)0x0,L"4,0",3
                                      );
                            QString::QString(&local_800,(DataPointer *)local_818);
                            bVar3 = QTest::qCompare(&local_798,&local_800,
                                                    "testModel.index(6, 0).data().toString()",
                                                    "QStringLiteral(\"4,0\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,2000);
                            QString::~QString(&local_800);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)local_818);
                            QString::~QString(&local_798);
                            QVariant::~QVariant(&local_7b8);
                            if (((bVar3 ^ 0xffU) & 1) == 0) {
                              for (local_81c = 2; local_81c < 7; local_81c = local_81c + 1) {
                                GenericModel::headerData((int)&local_840,(int)&probe + 8,local_81c);
                                iVar4 = QVariant::toInt((bool *)&local_840);
                                bVar2 = QTest::qCompare(iVar4,local_81c + -2,
                                                                                                                
                                                  "testModel.headerData(i, Qt::Vertical).toInt()",
                                                  "i - 2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d2);
                                QVariant::~QVariant(&local_840);
                                if (((bVar2 ^ 0xff) & 1) != 0) {
                                  local_28c = 1;
                                  goto LAB_001401f6;
                                }
                              }
                              GenericModel::index((int)&local_890,(int)&probe + 8,(QModelIndex *)0x0
                                                 );
                              QModelIndex::data(&local_878,&local_890,0);
                              QVariant::toString();
                              QArrayDataPointer<char16_t>::QArrayDataPointer
                                        (&local_8c0,(Data *)0x0,L"r0,c0",5);
                              QString::QString(&local_8a8,&local_8c0);
                              bVar3 = QTest::qCompare(&local_858,&local_8a8,
                                                                                                            
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r0,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d3);
                              QString::~QString(&local_8a8);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_8c0);
                              QString::~QString(&local_858);
                              QVariant::~QVariant(&local_878);
                              if (((bVar3 ^ 0xffU) & 1) == 0) {
                                GenericModel::index((int)&local_910,(int)&probe + 8,
                                                    (QModelIndex *)0x1);
                                QModelIndex::data(&local_8f8,&local_910,0);
                                QVariant::toString();
                                QArrayDataPointer<char16_t>::QArrayDataPointer
                                          (&local_940,(Data *)0x0,L"r3,c0",5);
                                QString::QString(&local_928,&local_940);
                                bVar3 = QTest::qCompare(&local_8d8,&local_928,
                                                                                                                
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r3,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d4);
                                QString::~QString(&local_928);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_940);
                                QString::~QString(&local_8d8);
                                QVariant::~QVariant(&local_8f8);
                                if (((bVar3 ^ 0xffU) & 1) == 0) {
                                  GenericModel::index((int)&local_990,(int)&probe + 8,
                                                      (QModelIndex *)0x2);
                                  QModelIndex::data(&local_978,&local_990,0);
                                  QVariant::toString();
                                  QArrayDataPointer<char16_t>::QArrayDataPointer
                                            (&local_9c0,(Data *)0x0,L"r4,c0",5);
                                  QString::QString(&local_9a8,&local_9c0);
                                  bVar3 = QTest::qCompare(&local_958,&local_9a8,
                                                                                                                    
                                                  "testModel.index(2, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r4,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d5);
                                  QString::~QString(&local_9a8);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_9c0);
                                  QString::~QString(&local_958);
                                  QVariant::~QVariant(&local_978);
                                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                                    local_28c = 0;
                                  }
                                  else {
                                    local_28c = 1;
                                  }
                                }
                                else {
                                  local_28c = 1;
                                }
                              }
                              else {
                                local_28c = 1;
                              }
                            }
                            else {
                              local_28c = 1;
                            }
                          }
                          else {
                            local_28c = 1;
                          }
                        }
                        else {
                          local_28c = 1;
                        }
                      }
                      else {
                        local_28c = 1;
                      }
                    }
                    else {
                      local_28c = 1;
                    }
                  }
                  else {
                    local_28c = 1;
                  }
                }
                else {
                  local_28c = 1;
                }
              }
              else {
                local_28c = 1;
              }
            }
            else {
              local_28c = 1;
            }
          }
          else {
            local_28c = 1;
          }
        }
        else {
          local_28c = 1;
        }
      }
    }
  }
  else {
    local_28c = 1;
  }
LAB_001401f6:
  ModelTest::~ModelTest((ModelTest *)local_170);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsFromBranchToRoot()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 5, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 4, parIndex);
    testModel.insertRows(0, 5, parIndex);
    for (int r = 0; r < testModel.rowCount(parIndex); ++r) {
        for (int c = 0; c < testModel.columnCount(parIndex); ++c)
            testModel.setData(testModel.index(r, c, parIndex), QStringLiteral("r%1,c%2").arg(r).arg(c));
    }

    QVERIFY(testModel.moveRows(parIndex, 1, 2, QModelIndex(), 0));
    QCOMPARE(testModel.rowCount(parIndex), 3);
    QCOMPARE(testModel.columnCount(parIndex), 4);
    QCOMPARE(testModel.rowCount(), 7);
    QCOMPARE(testModel.columnCount(), 4);
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("r1,c0"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("r2,c0"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("r1,c3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("r2,c3"));
    QCOMPARE(testModel.index(2, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(3, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(4, 0).data().toString(), QStringLiteral("2,0"));
    QCOMPARE(testModel.index(5, 0).data().toString(), QStringLiteral("3,0"));
    QCOMPARE(testModel.index(6, 0).data().toString(), QStringLiteral("4,0"));
    for (int i = 2; i < 7; ++i)
        QCOMPARE(testModel.headerData(i, Qt::Vertical).toInt(), i - 2);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("r0,c0"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("r3,c0"));
    QCOMPARE(testModel.index(2, 0, parIndex).data().toString(), QStringLiteral("r4,c0"));
}